

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptRegExpConstructor::SetPropertyBuiltIns
          (JavascriptRegExpConstructor *this,PropertyId propertyId,Var value,BOOL *result)

{
  ImplicitCallFlags *pIVar1;
  bool bVar2;
  JavascriptString *ptr;
  uint uVar4;
  BOOL BVar3;
  
  bVar2 = false;
  BVar3 = 0;
  uVar4 = propertyId - 0x1d0;
  if (uVar4 < 0x17) {
    if ((0x78f7feU >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0x801U >> (uVar4 & 0x1f) & 1) == 0) {
        return false;
      }
      ptr = JavascriptConversion::ToString
                      (value,(((((this->super_RuntimeFunction).super_JavascriptFunction.
                                 super_DynamicObject.super_RecyclableObject.type.ptr)->
                               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                             ptr);
      EnsureValues(this);
      Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet(&this->lastInput,ptr);
      pIVar1 = &((((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                     super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr)->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_Accessor;
      BVar3 = 1;
    }
    *result = BVar3;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool JavascriptRegExpConstructor::SetPropertyBuiltIns(PropertyId propertyId, Var value, BOOL* result)
    {
        switch (propertyId)
        {
        case PropertyIds::input:
        case PropertyIds::$_:
            //TODO: review: although the 'input' property is marked as readonly, it has a set on V5.8. There is no spec on this.
            {
                auto tempInput = JavascriptConversion::ToString(value, this->GetScriptContext());
                // Above toString call can cause user code to be called, which may call .match to invalidate our state, ensure that we have proper values in case that happens.
                EnsureValues(); // The last match info relies on the last input. Use it before it is changed.
                this->lastInput = tempInput;
            }

            // Set implicit call flags since we are not necessarily making the original stored value available on re-load
            // and are killing the store that backs two exposed properties.
            this->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            *result = true;
            return true;
        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:
        case PropertyIds::lastParen:
        case PropertyIds::$Plus:
        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:
        case PropertyIds::rightContext:
        case PropertyIds::$Tick:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
        case PropertyIds::index:
            *result = false;
            return true;
        default:
            return false;
        }
    }